

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-gost3411.c
# Opt level: O0

void pp_crypto_hash_gost3411_process(PHashGOST3411 *ctx,puint32 *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  puint32 CM1_127;
  puint32 CM1_126;
  puint32 CM1_125;
  puint32 CM1_124;
  puint32 CM1_123;
  puint32 CM1_122;
  puint32 CM1_121;
  puint32 CM1_120;
  puint32 CM1_119;
  puint32 CM1_118;
  puint32 CM1_117;
  puint32 CM1_116;
  puint32 CM1_115;
  puint32 CM1_114;
  puint32 CM1_113;
  puint32 CM1_112;
  puint32 CM1_111;
  puint32 CM1_110;
  puint32 CM1_109;
  puint32 CM1_108;
  puint32 CM1_107;
  puint32 CM1_106;
  puint32 CM1_105;
  puint32 CM1_104;
  puint32 CM1_103;
  puint32 CM1_102;
  puint32 CM1_101;
  puint32 CM1_100;
  puint32 CM1_99;
  puint32 CM1_98;
  puint32 CM1_97;
  puint32 CM1_96;
  puint32 N_3 [2];
  puint32 CM1_95;
  puint32 CM1_94;
  puint32 CM1_93;
  puint32 CM1_92;
  puint32 CM1_91;
  puint32 CM1_90;
  puint32 CM1_89;
  puint32 CM1_88;
  puint32 CM1_87;
  puint32 CM1_86;
  puint32 CM1_85;
  puint32 CM1_84;
  puint32 CM1_83;
  puint32 CM1_82;
  puint32 CM1_81;
  puint32 CM1_80;
  puint32 CM1_79;
  puint32 CM1_78;
  puint32 CM1_77;
  puint32 CM1_76;
  puint32 CM1_75;
  puint32 CM1_74;
  puint32 CM1_73;
  puint32 CM1_72;
  puint32 CM1_71;
  puint32 CM1_70;
  puint32 CM1_69;
  puint32 CM1_68;
  puint32 CM1_67;
  puint32 CM1_66;
  puint32 CM1_65;
  puint32 CM1_64;
  puint32 N_2 [2];
  puint32 CM1_63;
  puint32 CM1_62;
  puint32 CM1_61;
  puint32 CM1_60;
  puint32 CM1_59;
  puint32 CM1_58;
  puint32 CM1_57;
  puint32 CM1_56;
  puint32 CM1_55;
  puint32 CM1_54;
  puint32 CM1_53;
  puint32 CM1_52;
  puint32 CM1_51;
  puint32 CM1_50;
  puint32 CM1_49;
  puint32 CM1_48;
  puint32 CM1_47;
  puint32 CM1_46;
  puint32 CM1_45;
  puint32 CM1_44;
  puint32 CM1_43;
  puint32 CM1_42;
  puint32 CM1_41;
  puint32 CM1_40;
  puint32 CM1_39;
  puint32 CM1_38;
  puint32 CM1_37;
  puint32 CM1_36;
  puint32 CM1_35;
  puint32 CM1_34;
  puint32 CM1_33;
  puint32 CM1_32;
  puint32 N_1 [2];
  puint32 CM1_31;
  puint32 CM1_30;
  puint32 CM1_29;
  puint32 CM1_28;
  puint32 CM1_27;
  puint32 CM1_26;
  puint32 CM1_25;
  puint32 CM1_24;
  puint32 CM1_23;
  puint32 CM1_22;
  puint32 CM1_21;
  puint32 CM1_20;
  puint32 CM1_19;
  puint32 CM1_18;
  puint32 CM1_17;
  puint32 CM1_16;
  puint32 CM1_15;
  puint32 CM1_14;
  puint32 CM1_13;
  puint32 CM1_12;
  puint32 CM1_11;
  puint32 CM1_10;
  puint32 CM1_9;
  puint32 CM1_8;
  puint32 CM1_7;
  puint32 CM1_6;
  puint32 CM1_5;
  puint32 CM1_4;
  puint32 CM1_3;
  puint32 CM1_2;
  puint32 CM1_1;
  puint32 CM1;
  puint32 N [2];
  puint32 K [4] [8];
  puint32 S [8];
  puint32 W [8];
  puint32 V [8];
  puint32 U [8];
  puint32 *data_local;
  PHashGOST3411 *ctx_local;
  
  V[6] = (puint32)*(undefined8 *)ctx->hash;
  W[6] = (puint32)*(undefined8 *)data;
  uVar1 = V[6] ^ W[6];
  V[7] = (puint32)((ulong)*(undefined8 *)ctx->hash >> 0x20);
  W[7] = (puint32)((ulong)*(undefined8 *)data >> 0x20);
  uVar2 = V[7] ^ W[7];
  U[0] = (puint32)*(undefined8 *)(ctx->hash + 2);
  V[0] = (puint32)*(undefined8 *)(data + 2);
  uVar3 = U[0] ^ V[0];
  U[1] = (puint32)((ulong)*(undefined8 *)(ctx->hash + 2) >> 0x20);
  V[1] = (puint32)((ulong)*(undefined8 *)(data + 2) >> 0x20);
  uVar4 = U[1] ^ V[1];
  U[2] = (puint32)*(undefined8 *)(ctx->hash + 4);
  V[2] = (puint32)*(undefined8 *)(data + 4);
  uVar5 = U[2] ^ V[2];
  U[3] = (puint32)((ulong)*(undefined8 *)(ctx->hash + 4) >> 0x20);
  V[3] = (puint32)((ulong)*(undefined8 *)(data + 4) >> 0x20);
  uVar6 = U[3] ^ V[3];
  U[4] = (puint32)*(undefined8 *)(ctx->hash + 6);
  V[4] = (puint32)*(undefined8 *)(data + 6);
  uVar7 = U[4] ^ V[4];
  U[5] = (puint32)((ulong)*(undefined8 *)(ctx->hash + 6) >> 0x20);
  V[5] = (puint32)((ulong)*(undefined8 *)(data + 6) >> 0x20);
  uVar8 = U[5] ^ V[5];
  uVar9 = uVar1 & 0xff | (uVar3 & 0xff) << 8 | (uVar5 & 0xff) << 0x10 | uVar7 << 0x18;
  uVar10 = uVar1 >> 8 & 0xff | uVar3 & 0xff00 | (uVar5 & 0xff00) << 8 | (uVar7 & 0xff00) << 0x10;
  uVar11 = uVar1 >> 0x10 & 0xff | uVar3 >> 8 & 0xff00 | uVar5 & 0xff0000 | (uVar7 & 0xff0000) << 8;
  uVar12 = uVar1 >> 0x18 | uVar3 >> 0x10 & 0xff00 | uVar5 >> 8 & 0xff0000 | uVar7 & 0xff000000;
  uVar13 = uVar2 & 0xff | (uVar4 & 0xff) << 8 | (uVar6 & 0xff) << 0x10 | uVar8 << 0x18;
  uVar14 = uVar2 >> 8 & 0xff | uVar4 & 0xff00 | (uVar6 & 0xff00) << 8 | (uVar8 & 0xff00) << 0x10;
  uVar15 = uVar2 >> 0x10 & 0xff | uVar4 >> 8 & 0xff00 | uVar6 & 0xff0000 | (uVar8 & 0xff0000) << 8;
  uVar16 = uVar2 >> 0x18 | uVar4 >> 0x10 & 0xff00 | uVar6 >> 8 & 0xff0000 | uVar8 & 0xff000000;
  uVar1 = U[0] ^ V[2];
  uVar2 = U[1] ^ V[3];
  uVar3 = U[2] ^ V[4];
  uVar4 = U[3] ^ V[5];
  uVar35 = V[0] ^ W[6];
  uVar5 = U[4] ^ uVar35;
  uVar36 = V[1] ^ W[7];
  uVar6 = U[5] ^ uVar36;
  uVar37 = V[2] ^ V[0];
  uVar7 = U[0] ^ V[6] ^ uVar37;
  uVar38 = V[3] ^ V[1];
  uVar8 = U[1] ^ V[7] ^ uVar38;
  uVar17 = uVar1 & 0xff | (uVar3 & 0xff) << 8 | (uVar5 & 0xff) << 0x10 | uVar7 << 0x18;
  uVar18 = uVar1 >> 8 & 0xff | uVar3 & 0xff00 | (uVar5 & 0xff00) << 8 | (uVar7 & 0xff00) << 0x10;
  uVar19 = uVar1 >> 0x10 & 0xff | uVar3 >> 8 & 0xff00 | uVar5 & 0xff0000 | (uVar7 & 0xff0000) << 8;
  uVar20 = uVar1 >> 0x18 | uVar3 >> 0x10 & 0xff00 | uVar5 >> 8 & 0xff0000 | uVar7 & 0xff000000;
  uVar21 = uVar2 & 0xff | (uVar4 & 0xff) << 8 | (uVar6 & 0xff) << 0x10 | uVar8 << 0x18;
  uVar22 = uVar2 >> 8 & 0xff | uVar4 & 0xff00 | (uVar6 & 0xff00) << 8 | (uVar8 & 0xff00) << 0x10;
  uVar23 = uVar2 >> 0x10 & 0xff | uVar4 >> 8 & 0xff00 | uVar6 & 0xff0000 | (uVar8 & 0xff0000) << 8;
  uVar24 = uVar2 >> 0x18 | uVar4 >> 0x10 & 0xff00 | uVar6 >> 8 & 0xff0000 | uVar8 & 0xff000000;
  uVar25 = U[2] ^ 0xff ^ U[0];
  uVar26 = U[3] ^ 0xff00ffff ^ U[1];
  U[2] = U[2] ^ 0xff00ff00;
  U[3] = U[3] ^ 0xff00ff00;
  U[4] = U[4] ^ 0xff00ff;
  U[5] = U[5] ^ 0xff00ff;
  uVar27 = U[0] ^ V[6] ^ 0xffff00;
  V[7] = U[1] ^ V[7] ^ 0xff0000ff;
  uVar1 = U[2] ^ uVar35;
  uVar2 = U[4] ^ uVar37;
  uVar39 = V[4] ^ V[2];
  uVar3 = uVar27 ^ uVar39;
  uVar4 = uVar25 ^ uVar35 ^ V[4];
  uVar5 = U[3] ^ uVar36;
  uVar6 = U[5] ^ uVar38;
  uVar40 = V[5] ^ V[3];
  uVar7 = V[7] ^ uVar40;
  uVar8 = uVar26 ^ uVar36 ^ V[5];
  uVar28 = uVar1 & 0xff | (uVar2 & 0xff) << 8 | (uVar3 & 0xff) << 0x10 | uVar4 << 0x18;
  uVar29 = uVar1 >> 8 & 0xff | uVar2 & 0xff00 | (uVar3 & 0xff00) << 8 | (uVar4 & 0xff00) << 0x10;
  uVar30 = uVar1 >> 0x10 & 0xff | uVar2 >> 8 & 0xff00 | uVar3 & 0xff0000 | (uVar4 & 0xff0000) << 8;
  uVar31 = uVar1 >> 0x18 | uVar2 >> 0x10 & 0xff00 | uVar3 >> 8 & 0xff0000 | uVar4 & 0xff000000;
  uVar32 = uVar5 & 0xff | (uVar6 & 0xff) << 8 | (uVar7 & 0xff) << 0x10 | uVar8 << 0x18;
  uVar33 = uVar5 >> 8 & 0xff | uVar6 & 0xff00 | (uVar7 & 0xff00) << 8 | (uVar8 & 0xff00) << 0x10;
  uVar34 = uVar5 >> 0x10 & 0xff | uVar6 >> 8 & 0xff00 | uVar7 & 0xff0000 | (uVar8 & 0xff0000) << 8;
  uVar7 = uVar5 >> 0x18 | uVar6 >> 0x10 & 0xff00 | uVar7 >> 8 & 0xff0000 | uVar8 & 0xff000000;
  uVar1 = U[4] ^ uVar39;
  uVar2 = U[5] ^ uVar40;
  uVar27 = uVar27 ^ uVar35 ^ V[4];
  uVar3 = V[7] ^ uVar36 ^ V[5];
  uVar25 = uVar25 ^ uVar37 ^ uVar35;
  uVar26 = uVar26 ^ uVar38 ^ uVar36;
  uVar4 = U[4] ^ U[2] ^ uVar39 ^ uVar37;
  uVar5 = U[5] ^ U[3] ^ uVar40 ^ uVar38;
  uVar40 = uVar1 & 0xff | (uVar27 & 0xff) << 8 | (uVar25 & 0xff) << 0x10 | uVar4 << 0x18;
  uVar39 = uVar1 >> 8 & 0xff | uVar27 & 0xff00 | (uVar25 & 0xff00) << 8 | (uVar4 & 0xff00) << 0x10;
  uVar38 = uVar1 >> 0x10 & 0xff | uVar27 >> 8 & 0xff00 | uVar25 & 0xff0000 | (uVar4 & 0xff0000) << 8
  ;
  uVar37 = uVar1 >> 0x18 | uVar27 >> 0x10 & 0xff00 | uVar25 >> 8 & 0xff0000 | uVar4 & 0xff000000;
  uVar36 = uVar2 & 0xff | (uVar3 & 0xff) << 8 | (uVar26 & 0xff) << 0x10 | uVar5 << 0x18;
  uVar35 = uVar2 >> 8 & 0xff | uVar3 & 0xff00 | (uVar26 & 0xff00) << 8 | (uVar5 & 0xff00) << 0x10;
  uVar25 = uVar2 >> 0x10 & 0xff | uVar3 >> 8 & 0xff00 | uVar26 & 0xff0000 | (uVar5 & 0xff0000) << 8;
  uVar27 = uVar2 >> 0x18 | uVar3 >> 0x10 & 0xff00 | uVar26 >> 8 & 0xff0000 | uVar5 & 0xff000000;
  CM1_1 = (puint32)*(undefined8 *)ctx->hash;
  uVar1 = CM1_1 + uVar9;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  CM1 = (puint32)((ulong)*(undefined8 *)ctx->hash >> 0x20);
  uVar3 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ CM1;
  uVar1 = uVar3 + uVar10;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ CM1_1;
  uVar1 = uVar4 + uVar11;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar1 = uVar3 + uVar12;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar1 = uVar4 + uVar13;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar1 = uVar3 + uVar14;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar1 = uVar4 + uVar15;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar1 = uVar3 + uVar16;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar1 = uVar4 + uVar9;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar1 = uVar3 + uVar10;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar1 = uVar4 + uVar11;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar1 = uVar3 + uVar12;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar1 = uVar4 + uVar13;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar1 = uVar3 + uVar14;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar1 = uVar4 + uVar15;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar1 = uVar3 + uVar16;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar1 = uVar4 + uVar9;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar1 = uVar3 + uVar10;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar1 = uVar4 + uVar11;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar1 = uVar3 + uVar12;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar1 = uVar4 + uVar13;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar1 = uVar3 + uVar14;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar1 = uVar4 + uVar15;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar1 = uVar3 + uVar16;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar16 = uVar4 + uVar16;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar16 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar16 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar16 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar16 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar16 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar16 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar16 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar16 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar15 = uVar3 + uVar15;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar15 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar15 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar15 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar15 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar15 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar15 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar15 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar15 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar14 = uVar4 + uVar14;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar14 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar14 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar14 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar14 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar14 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar14 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar14 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar14 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar13 = uVar3 + uVar13;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar13 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar13 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar13 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar13 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar13 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar13 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar13 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar13 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar12 = uVar4 + uVar12;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar12 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar12 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar12 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar12 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar12 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar12 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar12 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar12 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar11 = uVar3 + uVar11;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar11 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar11 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar11 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar11 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar11 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar11 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar11 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar11 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  uVar10 = uVar4 + uVar10;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar10 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar10 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar10 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar10 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar10 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar10 >> 0x14 & 0xf] << 0x14;
  uVar3 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar10 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar10 >> 0x1c] << 0x1c) >> 0x15) ^ uVar3;
  uVar9 = uVar3 + uVar9;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar9 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar9 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar9 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar9 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar9 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar9 >> 0x14 & 0xf] << 0x14;
  uVar4 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar9 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar9 >> 0x1c] << 0x1c) >> 0x15) ^ uVar4;
  CM1_33 = (puint32)*(undefined8 *)(ctx->hash + 2);
  uVar1 = CM1_33 + uVar17;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  CM1_32 = (puint32)((ulong)*(undefined8 *)(ctx->hash + 2) >> 0x20);
  uVar5 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ CM1_32;
  uVar1 = uVar5 + uVar18;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ CM1_33;
  uVar1 = uVar6 + uVar19;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar1 = uVar5 + uVar20;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar1 = uVar6 + uVar21;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar1 = uVar5 + uVar22;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar1 = uVar6 + uVar23;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar1 = uVar5 + uVar24;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar1 = uVar6 + uVar17;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar1 = uVar5 + uVar18;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar1 = uVar6 + uVar19;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar1 = uVar5 + uVar20;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar1 = uVar6 + uVar21;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar1 = uVar5 + uVar22;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar1 = uVar6 + uVar23;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar1 = uVar5 + uVar24;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar1 = uVar6 + uVar17;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar1 = uVar5 + uVar18;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar1 = uVar6 + uVar19;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar1 = uVar5 + uVar20;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar1 = uVar6 + uVar21;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar1 = uVar5 + uVar22;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar1 = uVar6 + uVar23;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar1 = uVar5 + uVar24;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar24 = uVar6 + uVar24;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar24 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar24 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar24 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar24 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar24 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar24 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar24 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar24 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar23 = uVar5 + uVar23;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar23 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar23 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar23 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar23 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar23 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar23 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar23 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar23 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar22 = uVar6 + uVar22;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar22 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar22 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar22 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar22 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar22 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar22 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar22 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar22 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar21 = uVar5 + uVar21;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar21 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar21 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar21 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar21 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar21 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar21 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar21 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar21 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar20 = uVar6 + uVar20;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar20 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar20 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar20 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar20 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar20 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar20 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar20 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar20 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar19 = uVar5 + uVar19;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar19 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar19 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar19 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar19 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar19 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar19 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar19 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar19 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  uVar18 = uVar6 + uVar18;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar18 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar18 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar18 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar18 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar18 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar18 >> 0x14 & 0xf] << 0x14;
  uVar5 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar18 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar18 >> 0x1c] << 0x1c) >> 0x15) ^ uVar5;
  uVar17 = uVar5 + uVar17;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar17 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar17 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar17 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar17 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar17 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar17 >> 0x14 & 0xf] << 0x14;
  uVar6 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar17 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar17 >> 0x1c] << 0x1c) >> 0x15) ^ uVar6;
  CM1_65 = (puint32)*(undefined8 *)(ctx->hash + 4);
  uVar1 = CM1_65 + uVar28;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  CM1_64 = (puint32)((ulong)*(undefined8 *)(ctx->hash + 4) >> 0x20);
  uVar13 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ CM1_64;
  uVar1 = uVar13 + uVar29;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ CM1_65;
  uVar1 = uVar8 + uVar30;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar1 = uVar13 + uVar31;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar1 = uVar8 + uVar32;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar1 = uVar13 + uVar33;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar1 = uVar8 + uVar34;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar1 = uVar13 + uVar7;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar1 = uVar8 + uVar28;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar1 = uVar13 + uVar29;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar1 = uVar8 + uVar30;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar1 = uVar13 + uVar31;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar1 = uVar8 + uVar32;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar1 = uVar13 + uVar33;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar1 = uVar8 + uVar34;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar1 = uVar13 + uVar7;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar1 = uVar8 + uVar28;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar1 = uVar13 + uVar29;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar1 = uVar8 + uVar30;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar1 = uVar13 + uVar31;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar1 = uVar8 + uVar32;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar1 = uVar13 + uVar33;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar1 = uVar8 + uVar34;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar1 = uVar13 + uVar7;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar7 = uVar8 + uVar7;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar7 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar7 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar7 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar7 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar7 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar7 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar1 << 0xb |
           (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar7 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar7 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar34 = uVar13 + uVar34;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar34 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar34 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar34 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar34 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar34 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar34 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar34 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar34 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar33 = uVar8 + uVar33;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar33 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar33 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar33 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar33 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar33 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar33 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar1 << 0xb |
           (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar33 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar33 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar32 = uVar13 + uVar32;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar32 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar32 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar32 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar32 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar32 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar32 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar32 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar32 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar31 = uVar8 + uVar31;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar31 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar31 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar31 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar31 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar31 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar31 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar1 << 0xb |
           (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar31 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar31 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar30 = uVar13 + uVar30;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar30 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar30 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar30 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar30 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar30 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar30 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar30 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar30 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  uVar29 = uVar8 + uVar29;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar29 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar29 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar29 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar29 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar29 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar29 >> 0x14 & 0xf] << 0x14;
  uVar13 = (uVar1 << 0xb |
           (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar29 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar29 >> 0x1c] << 0x1c) >> 0x15) ^ uVar13;
  uVar28 = uVar13 + uVar28;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar28 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar28 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar28 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar28 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar28 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar28 >> 0x14 & 0xf] << 0x14;
  uVar8 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar28 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar28 >> 0x1c] << 0x1c) >> 0x15) ^ uVar8;
  CM1_97 = (puint32)*(undefined8 *)(ctx->hash + 6);
  uVar1 = CM1_97 + uVar40;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  CM1_96 = (puint32)((ulong)*(undefined8 *)(ctx->hash + 6) >> 0x20);
  uVar7 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ CM1_96;
  uVar1 = uVar7 + uVar39;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ CM1_97;
  uVar1 = uVar26 + uVar38;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar1 = uVar7 + uVar37;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar1 = uVar26 + uVar36;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar1 = uVar7 + uVar35;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar1 = uVar26 + uVar25;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar1 = uVar7 + uVar27;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar1 = uVar26 + uVar40;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar1 = uVar7 + uVar39;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar1 = uVar26 + uVar38;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar1 = uVar7 + uVar37;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar1 = uVar26 + uVar36;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar1 = uVar7 + uVar35;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar1 = uVar26 + uVar25;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar1 = uVar7 + uVar27;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar1 = uVar26 + uVar40;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar1 = uVar7 + uVar39;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar1 = uVar26 + uVar38;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar1 = uVar7 + uVar37;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar1 = uVar26 + uVar36;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar1 = uVar7 + uVar35;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar1 = uVar26 + uVar25;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar2 << 0xb |
          (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar1 = uVar7 + uVar27;
  uVar2 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar1 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar1 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar1 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar1 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar1 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar1 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar2 << 0xb |
           (uVar2 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar1 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar1 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar27 = uVar26 + uVar27;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar27 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar27 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar27 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar27 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar27 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar27 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar27 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar27 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar25 = uVar7 + uVar25;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar25 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar25 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar25 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar25 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar25 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar25 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar1 << 0xb |
           (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar25 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar25 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar35 = uVar26 + uVar35;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar35 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar35 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar35 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar35 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar35 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar35 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar35 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar35 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar36 = uVar7 + uVar36;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar36 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar36 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar36 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar36 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar36 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar36 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar1 << 0xb |
           (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar36 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar36 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar37 = uVar26 + uVar37;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar37 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar37 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar37 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar37 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar37 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar37 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar37 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar37 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar38 = uVar7 + uVar38;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar38 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar38 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar38 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar38 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar38 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar38 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar1 << 0xb |
           (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar38 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar38 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar39 = uVar26 + uVar39;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar39 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar39 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar39 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar39 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar39 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar39 >> 0x14 & 0xf] << 0x14;
  uVar7 = (uVar1 << 0xb |
          (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar39 >> 0x18 & 0xf] << 0x18 |
          (uint)pp_crypto_hash_gost3411_K_block[7][uVar39 >> 0x1c] << 0x1c) >> 0x15) ^ uVar7;
  uVar40 = uVar7 + uVar40;
  uVar1 = (uint)pp_crypto_hash_gost3411_K_block[0][uVar40 & 0xf] |
          (uint)pp_crypto_hash_gost3411_K_block[1][uVar40 >> 4 & 0xf] << 4 |
          (uint)pp_crypto_hash_gost3411_K_block[2][uVar40 >> 8 & 0xf] << 8 |
          (uint)pp_crypto_hash_gost3411_K_block[3][uVar40 >> 0xc & 0xf] << 0xc |
          (uint)pp_crypto_hash_gost3411_K_block[4][uVar40 >> 0x10 & 0xf] << 0x10 |
          (uint)pp_crypto_hash_gost3411_K_block[5][uVar40 >> 0x14 & 0xf] << 0x14;
  uVar26 = (uVar1 << 0xb |
           (uVar1 | (uint)pp_crypto_hash_gost3411_K_block[6][uVar40 >> 0x18 & 0xf] << 0x18 |
           (uint)pp_crypto_hash_gost3411_K_block[7][uVar40 >> 0x1c] << 0x1c) >> 0x15) ^ uVar26;
  uVar1 = *data ^ uVar7;
  uVar2 = data[1] ^ uVar26;
  uVar27 = data[2] ^ uVar3 & 0xffff ^ uVar3 >> 0x10 ^ uVar3 << 0x10 ^ uVar4 & 0xffff ^ uVar4 >> 0x10
           ^ uVar5 << 0x10 ^ uVar26 & 0xffff0000 ^ uVar7 << 0x10 ^ uVar26 >> 0x10 ^ uVar7;
  uVar25 = data[3] ^ uVar3 & 0xffff ^ uVar3 << 0x10 ^ uVar5 << 0x10 ^ uVar4 & 0xffff ^ uVar4 << 0x10
           ^ uVar4 >> 0x10 ^ uVar26 & 0xffff ^ uVar5 >> 0x10 ^ uVar6 << 0x10 ^ uVar7 << 0x10 ^
           uVar7 >> 0x10 ^ uVar26 << 0x10 ^ uVar26 >> 0x10 ^ uVar7;
  uVar16 = data[4] ^ uVar3 & 0xffff0000 ^ uVar3 << 0x10 ^ uVar3 >> 0x10 ^ uVar4 & 0xffff0000 ^
           uVar4 >> 0x10 ^ uVar5 << 0x10 ^ uVar26 & 0xffff ^ uVar6 << 0x10 ^ uVar6 >> 0x10 ^
           uVar13 << 0x10 ^ uVar7 << 0x10 ^ uVar7 >> 0x10 ^ uVar5 >> 0x10 ^ uVar26 << 0x10;
  uVar15 = data[5] ^ uVar3 & 0xffff0000 ^ uVar3 >> 0x10 ^ uVar3 << 0x10 ^ uVar4 & 0xffff ^
           uVar26 >> 0x10 ^ uVar5 >> 0x10 ^ uVar26 & 0xffff0000 ^ uVar6 >> 0x10 ^ uVar13 << 0x10 ^
           uVar13 >> 0x10 ^ uVar8 << 0x10 ^ uVar7 << 0x10 ^ uVar7 >> 0x10 ^ uVar6 << 0x10 ^
           uVar26 << 0x10 ^ uVar5;
  uVar14 = data[6] ^ uVar13 >> 0x10 ^ uVar4 >> 0x10 ^ uVar5 << 0x10 ^ uVar26 << 0x10 ^ uVar6 >> 0x10
           ^ uVar13 << 0x10 ^ uVar8 << 0x10 ^ uVar8 >> 0x10 ^ uVar7 << 0x10 ^ uVar7 >> 0x10 ^ uVar7
           ^ uVar3 ^ uVar6;
  uVar13 = data[7] ^ uVar3 & 0xffff0000 ^ uVar3 << 0x10 ^ uVar4 << 0x10 ^ uVar4 & 0xffff ^
           uVar5 >> 0x10 ^ uVar6 << 0x10 ^ uVar26 & 0xffff ^ uVar13 >> 0x10 ^ uVar8 << 0x10 ^
           uVar8 >> 0x10 ^ uVar7 >> 0x10 ^ uVar26 << 0x10 ^ uVar26 >> 0x10 ^ uVar13;
  uVar3 = ctx->hash[0] ^ uVar2 << 0x10;
  uVar4 = uVar3 ^ uVar1 >> 0x10;
  uVar5 = ctx->hash[1] ^ uVar27 << 0x10;
  uVar6 = uVar5 ^ uVar2 >> 0x10;
  uVar7 = ctx->hash[2] ^ uVar25 << 0x10;
  uVar8 = uVar7 ^ uVar27 >> 0x10;
  uVar27 = ctx->hash[3] ^ (uVar16 ^ uVar26 >> 0x10) << 0x10;
  uVar25 = uVar27 ^ uVar25 >> 0x10;
  uVar26 = ctx->hash[4] ^ uVar15 << 0x10;
  uVar16 = uVar26 ^ uVar16 >> 0x10;
  uVar12 = ctx->hash[5] ^ uVar14 << 0x10;
  uVar15 = uVar12 ^ uVar15 >> 0x10;
  uVar11 = ctx->hash[6] ^ uVar13 << 0x10;
  uVar10 = uVar11 ^ uVar14 >> 0x10;
  uVar9 = ctx->hash[7] ^ uVar13 >> 0x10;
  uVar1 = uVar9 ^ uVar1 << 0x10 ^ uVar2 & 0xffff0000 ^ uVar2 << 0x10 ^ uVar13 & 0xffff0000 ^
          uVar14 << 0x10 ^ uVar1 & 0xffff0000;
  ctx->hash[0] = uVar4 & 0xffff0000 ^ uVar4 << 0x10 ^ uVar3 >> 0x10 ^ uVar6 & 0xffff0000 ^
                 uVar5 >> 0x10 ^ uVar8 << 0x10 ^ uVar1 & 0xffff ^ uVar27 >> 0x10 ^ uVar16 << 0x10 ^
                 uVar12 >> 0x10 ^ uVar11 >> 0x10 ^ uVar9 << 0x10 ^ uVar1 >> 0x10 ^ uVar15;
  ctx->hash[1] = uVar4 & 0xffff0000 ^ uVar4 << 0x10 ^ uVar3 >> 0x10 ^ uVar6 & 0xffff ^ uVar7 >> 0x10
                 ^ uVar25 << 0x10 ^ uVar1 & 0xffff0000 ^ uVar26 >> 0x10 ^ uVar15 << 0x10 ^
                 uVar10 << 0x10 ^ uVar1 >> 0x10 ^ uVar10 ^ uVar8;
  ctx->hash[2] = uVar4 & 0xffff ^ uVar4 << 0x10 ^ uVar6 << 0x10 ^ uVar1 & 0xffff ^ uVar5 >> 0x10 ^
                 uVar8 << 0x10 ^ uVar6 & 0xffff0000 ^ uVar27 >> 0x10 ^ uVar16 << 0x10 ^
                 uVar12 >> 0x10 ^ uVar11 >> 0x10 ^ uVar9 << 0x10 ^ uVar1 >> 0x10 ^ uVar25 ^ uVar10;
  ctx->hash[3] = uVar4 & 0xffff0000 ^ uVar4 << 0x10 ^ uVar3 >> 0x10 ^ uVar6 & 0xffff0000 ^
                 uVar5 >> 0x10 ^ uVar8 << 0x10 ^ uVar1 & 0xffff ^ uVar7 >> 0x10 ^ uVar25 << 0x10 ^
                 uVar26 >> 0x10 ^ uVar15 << 0x10 ^ uVar10 << 0x10 ^ uVar1 >> 0x10 ^ uVar8 ^ uVar16;
  ctx->hash[4] = uVar3 >> 0x10 ^ uVar6 << 0x10 ^ uVar7 >> 0x10 ^ uVar25 << 0x10 ^ uVar27 >> 0x10 ^
                 uVar16 << 0x10 ^ uVar12 >> 0x10 ^ uVar10 << 0x10 ^ uVar11 >> 0x10 ^ uVar9 << 0x10 ^
                 uVar6 ^ uVar8 ^ uVar25 ^ uVar15;
  ctx->hash[5] = uVar4 & 0xffff0000 ^ uVar4 << 0x10 ^ uVar6 << 0x10 ^ uVar6 & 0xffff0000 ^
                 uVar5 >> 0x10 ^ uVar8 << 0x10 ^ uVar1 & 0xffff0000 ^ uVar27 >> 0x10 ^
                 uVar16 << 0x10 ^ uVar26 >> 0x10 ^ uVar15 << 0x10 ^ uVar10 << 0x10 ^ uVar11 >> 0x10
                 ^ uVar9 << 0x10 ^ uVar1 >> 0x10 ^ uVar8 ^ uVar25 ^ uVar16 ^ uVar10;
  ctx->hash[6] = uVar7 >> 0x10 ^ uVar25 << 0x10 ^ uVar26 >> 0x10 ^ uVar15 << 0x10 ^ uVar12 >> 0x10 ^
                 uVar10 << 0x10 ^ uVar11 >> 0x10 ^ uVar9 << 0x10 ^ uVar1 ^ uVar4 ^ uVar8 ^ uVar25 ^
                 uVar16 ^ uVar15 ^ uVar10;
  ctx->hash[7] = uVar3 >> 0x10 ^ uVar6 << 0x10 ^ uVar5 >> 0x10 ^ uVar8 << 0x10 ^ uVar27 >> 0x10 ^
                 uVar16 << 0x10 ^ uVar12 >> 0x10 ^ uVar10 << 0x10 ^ uVar11 >> 0x10 ^ uVar9 << 0x10 ^
                 uVar1 ^ uVar4 ^ uVar25 ^ uVar16 ^ uVar15;
  return;
}

Assistant:

static void pp_crypto_hash_gost3411_process (PHashGOST3411	*ctx,
					     const puint32	data[8])
{
	puint32	U[8];
	puint32	V[8];
	puint32	W[8];
	puint32	S[8];
	puint32	K[4][8];

	memcpy (U, ctx->hash, 32);
	memcpy (V, data, 32);

	/* Generate first key: P (U xor V) */
	W[0] = U[0] ^ V[0];
	W[1] = U[1] ^ V[1];
	W[2] = U[2] ^ V[2];
	W[3] = U[3] ^ V[3];
	W[4] = U[4] ^ V[4];
	W[5] = U[5] ^ V[5];
	W[6] = U[6] ^ V[6];
	W[7] = U[7] ^ V[7];

	P_GOST_3411_P (W, K[0])

	/* Generate second key: P (A (U) xor A^2 (V)) */
	W[0] = U[2] ^ V[4];
	W[1] = U[3] ^ V[5];
	W[2] = U[4] ^ V[6];
	W[3] = U[5] ^ V[7];
	W[4] = U[6] ^ (V[0] ^= V[2]);
	W[5] = U[7] ^ (V[1] ^= V[3]);
	W[6] = (U[0] ^= U[2]) ^ (V[2] ^= V[4]);
	W[7] = (U[1] ^= U[3]) ^ (V[3] ^= V[5]);

	P_GOST_3411_P (W, K[1])

	/* Generate third key: P ((A^2 (U) + C3) xor A^4 (V)) */
	/* C3 = FF00FFFF 000000FF FF0000FF 00FFFF00 00FF00FF 00FF00FF FF00FF00 FF00FF00 */
	U[2] ^= U[4] ^ 0x000000FF;
	U[3] ^= U[5] ^ 0xFF00FFFF;
	U[4] ^= 0xFF00FF00;
	U[5] ^= 0xFF00FF00;
	U[6] ^= 0x00FF00FF;
	U[7] ^= 0x00FF00FF;
	U[0] ^= 0x00FFFF00;
	U[1] ^= 0xFF0000FF;

	W[0] = U[4] ^ V[0];
	W[2] = U[6] ^ V[2];
	W[4] = U[0] ^ (V[4] ^= V[6]);
	W[6] = U[2] ^ (V[6] ^= V[0]);
	W[1] = U[5] ^ V[1];
	W[3] = U[7] ^ V[3];
	W[5] = U[1] ^ (V[5] ^= V[7]);
	W[7] = U[3] ^ (V[7] ^= V[1]);

	P_GOST_3411_P (W, K[2])

	/* Generate forth key: P (A (A^2 (U) xor C3) xor A^6 (V)) */
	W[0] = U[6] ^ V[4];
	W[1] = U[7] ^ V[5];
	W[2] = U[0] ^ V[6];
	W[3] = U[1] ^ V[7];
	W[4] = U[2] ^ (V[0] ^= V[2]);
	W[5] = U[3] ^ (V[1] ^= V[3]);
	W[6] = (U[4] ^= U[6]) ^ (V[2] ^= V[4]);
	W[7] = (U[5] ^= U[7]) ^ (V[3] ^= V[5]);

	P_GOST_3411_P (W, K[3])

	/* Perform GOST 28147-89 encryption */
	P_GOST_28147_E (ctx->hash,      K[0], S)
	P_GOST_28147_E (ctx->hash + 2,  K[1], S + 2)
	P_GOST_28147_E (ctx->hash + 4,  K[2], S + 4)
	P_GOST_28147_E (ctx->hash + 6,  K[3], S + 6)

	/* Step hash function: H (M, Hprev) = PSI^61 (Hprev xor PSI (M xor PSI^12 (S))) */

	/* (12 rounds of LFSR) xor M */
	U[0] = data[0] ^ S[6];

	U[1] = data[1] ^ S[7];

	U[2] = data[2] ^ (S[0] & 0x0000FFFF)	^ (S[0] >> 16) ^ (S[0] << 16)
		       ^ (S[1] & 0x0000FFFF)	^ (S[1] >> 16) ^ (S[2] << 16)
		       ^ (S[7] & 0xFFFF0000)	^ (S[6] << 16) ^ (S[7] >> 16)
		       ^  S[6];

	U[3] = data[3] ^ (S[0] & 0x0000FFFF)	^ (S[0] << 16) ^ (S[2] << 16)
		       ^ (S[1] & 0x0000FFFF)	^ (S[1] << 16) ^ (S[1] >> 16)
		       ^ (S[7] & 0x0000FFFF)	^ (S[2] >> 16) ^ (S[3] << 16)
		       ^ (S[6] << 16)		^ (S[6] >> 16) ^ (S[7] << 16)
		       ^ (S[7] >> 16)		^ S[6];

	U[4] = data[4] ^ (S[0] & 0xFFFF0000)	^ (S[0] << 16) ^ (S[0] >> 16)
		       ^ (S[1] & 0xFFFF0000)	^ (S[1] >> 16) ^ (S[2] << 16)
		       ^ (S[7] & 0x0000FFFF)	^ (S[3] << 16) ^ (S[3] >> 16)
		       ^ (S[4] << 16)		^ (S[6] << 16) ^ (S[6] >> 16)
		       ^ (S[2] >> 16)		^ (S[7] << 16) ^ (S[7] >> 16);

	U[5] = data[5] ^ (S[0] & 0xFFFF0000)	^ (S[0] >> 16) ^ (S[0] << 16)
		       ^ (S[1] & 0x0000FFFF)	^ (S[7] >> 16) ^ (S[2] >> 16)
		       ^ (S[7] & 0xFFFF0000)	^ (S[3] >> 16) ^ (S[4] << 16)
		       ^ (S[4] >> 16)		^ (S[5] << 16) ^ (S[6] << 16)
		       ^ (S[6] >> 16)		^ (S[3] << 16) ^ (S[7] << 16)
		       ^ S[2];

	U[6] = data[6] ^ (S[4] >> 16)		^ (S[1] >> 16) ^ (S[2] << 16)
		       ^ (S[7] << 16)		^ (S[3] >> 16) ^ (S[4] << 16)
		       ^ (S[5] << 16)		^ (S[5] >> 16) ^ (S[6] << 16)
		       ^ (S[6] >> 16)		^ S[6]	       ^ S[0]
		       ^ S[3];

	U[7] = data[7] ^ (S[0] & 0xFFFF0000)	^ (S[0] << 16) ^ (S[1] << 16)
		       ^ (S[1] & 0x0000FFFF)	^ (S[2] >> 16) ^ (S[3] << 16)
		       ^ (S[7] & 0x0000FFFF)	^ (S[4] >> 16) ^ (S[5] << 16)
		       ^ (S[5] >> 16)		^ (S[6] >> 16) ^ (S[7] << 16)
		       ^ (S[7] >> 16)		^ S[4];

	/* (1 round of LFSR) xor Hprev */
	V[0] = ctx->hash[0] ^ (U[1] << 16) ^ (U[0] >> 16);
	V[1] = ctx->hash[1] ^ (U[2] << 16) ^ (U[1] >> 16);
	V[2] = ctx->hash[2] ^ (U[3] << 16) ^ (U[2] >> 16);
	V[3] = ctx->hash[3] ^ (U[4] << 16) ^ (U[3] >> 16);
	V[4] = ctx->hash[4] ^ (U[5] << 16) ^ (U[4] >> 16);
	V[5] = ctx->hash[5] ^ (U[6] << 16) ^ (U[5] >> 16);
	V[6] = ctx->hash[6] ^ (U[7] << 16) ^ (U[6] >> 16);
	V[7] = ctx->hash[7] ^ (U[7] >> 16)
	     ^ (U[0] << 16) ^ (U[1] & 0xFFFF0000)
	     ^ (U[1] << 16) ^ (U[7] & 0xFFFF0000)
	     ^ (U[6] << 16) ^ (U[0] & 0xFFFF0000);

	/* Final 61 rounds of LFSR */
	ctx->hash[0] = (V[0] & 0xFFFF0000)	^ (V[0] << 16)	^ (V[0] >> 16)
		     ^ (V[1] & 0xFFFF0000)	^ (V[1] >> 16)	^ (V[2] << 16)
		     ^ (V[7] & 0x0000FFFF)	^ (V[3] >> 16)	^ (V[4] << 16)
		     ^ (V[5] >> 16)		^ (V[6] >> 16)	^ (V[7] << 16)
		     ^ (V[7] >> 16)		^ V[5];
	ctx->hash[1] = (V[0] & 0xFFFF0000)	^ (V[0] << 16)	^ (V[0] >> 16)
		     ^ (V[1] & 0x0000FFFF)	^ (V[2] >> 16)	^ (V[3] << 16)
		     ^ (V[7] & 0xFFFF0000)	^ (V[4] >> 16)	^ (V[5] << 16)
		     ^ (V[6] << 16)		^ (V[7] >> 16)	^ V[6]
		     ^ V[2] ;
	ctx->hash[2] = (V[0] & 0x0000FFFF)	^ (V[0] << 16)	^ (V[1] << 16)
		     ^ (V[7] & 0x0000FFFF)	^ (V[1] >> 16)	^ (V[2] << 16)
		     ^ (V[1] & 0xFFFF0000)	^ (V[3] >> 16)  ^ (V[4] << 16)
		     ^ (V[5] >> 16)		^ (V[6] >> 16)	^ (V[7] << 16)
		     ^ (V[7] >> 16)		^ V[3]		^ V[6];
	ctx->hash[3] = (V[0] & 0xFFFF0000)	^ (V[0] << 16)	^ (V[0] >> 16)
		     ^ (V[1] & 0xFFFF0000)	^ (V[1] >> 16)	^ (V[2] << 16)
		     ^ (V[7] & 0x0000FFFF)	^ (V[2] >> 16)	^ (V[3] << 16)
		     ^ (V[4] >> 16)		^ (V[5] << 16)	^ (V[6] << 16)
		     ^ (V[7] >> 16)		^ V[2]		^ V[4];
	ctx->hash[4] = (V[0] >> 16)		^ (V[1] << 16)  ^ (V[2] >> 16)
		     ^ (V[3] << 16)		^ (V[3] >> 16)	^ (V[4] << 16)
		     ^ (V[5] >> 16)		^ (V[6] << 16)	^ (V[6] >> 16)
		     ^ (V[7] << 16)		^ V[1]		^ V[2]
		     ^ V[3]			^ V[5];
	ctx->hash[5] = (V[0] & 0xFFFF0000)	^ (V[0] << 16)	^ (V[1] << 16)
		     ^ (V[1] & 0xFFFF0000) 	^ (V[1] >> 16)	^ (V[2] << 16)
		     ^ (V[7] & 0xFFFF0000)	^ (V[3] >> 16)  ^ (V[4] << 16)
		     ^ (V[4] >> 16)		^ (V[5] << 16)	^ (V[6] << 16)
		     ^ (V[6] >> 16)		^ (V[7] << 16)	^ (V[7] >> 16)
		     ^ V[2]			^ V[3]		^ V[4]
		     ^ V[6];
	ctx->hash[6] = (V[2] >> 16)		^ (V[3] << 16)	^ (V[4] >> 16)
		     ^ (V[5] << 16)		^ (V[5] >> 16)	^ (V[6] << 16)
		     ^ (V[6] >> 16)		^ (V[7] << 16)	^ V[7]
		     ^ V[0]			^ V[2]		^ V[3]
		     ^ V[4]			^ V[5]		^ V[6];
	ctx->hash[7] = (V[0] >> 16)		^ (V[1] << 16)	^ (V[1] >> 16)
		     ^ (V[2] << 16)		^ (V[3] >> 16)	^ (V[4] << 16)
		     ^ (V[5] >> 16)		^ (V[6] << 16)	^ (V[6] >> 16)
		     ^ (V[7] << 16)		^ V[7]		^ V[0]
		     ^ V[3]			^ V[4]		^ V[5];
}